

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprMightBeIndexed(SrcList *pFrom,int *aiCurCol,Expr *pExpr,int op)

{
  Index *pIVar1;
  uint uVar2;
  u8 uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  Index **ppIVar7;
  
  uVar3 = pExpr->op;
  if (op - 0x37U < 4 && uVar3 == 0xb1) {
    pExpr = ((pExpr->x).pList)->a[0].pExpr;
    uVar3 = pExpr->op;
  }
  if (uVar3 == 0xa8) {
    *aiCurCol = pExpr->iTable;
    aiCurCol[1] = (int)pExpr->iColumn;
    uVar4 = 1;
  }
  else {
    uVar4 = 0;
    uVar2 = pFrom->nSrc;
    if (pFrom->nSrc < 1) {
      uVar2 = uVar4;
    }
    for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
      ppIVar7 = &(pFrom->a[uVar6].pSTab)->pIndex;
      while (pIVar1 = *ppIVar7, pIVar1 != (Index *)0x0) {
        ppIVar7 = &pIVar1->pNext;
        if (pIVar1->aColExpr != (ExprList *)0x0) {
          iVar5 = exprMightBeIndexed2(pFrom,aiCurCol,pExpr,(int)uVar6);
          return iVar5;
        }
      }
    }
  }
  return uVar4;
}

Assistant:

static int exprMightBeIndexed(
  SrcList *pFrom,        /* The FROM clause */
  int *aiCurCol,         /* Write the referenced table cursor & column here */
  Expr *pExpr,           /* An operand of a comparison operator */
  int op                 /* The specific comparison operator */
){
  int i;

  /* If this expression is a vector to the left or right of a
  ** inequality constraint (>, <, >= or <=), perform the processing
  ** on the first element of the vector.  */
  assert( TK_GT+1==TK_LE && TK_GT+2==TK_LT && TK_GT+3==TK_GE );
  assert( TK_IS<TK_GE && TK_ISNULL<TK_GE && TK_IN<TK_GE );
  assert( op<=TK_GE );
  if( pExpr->op==TK_VECTOR && (op>=TK_GT && ALWAYS(op<=TK_GE)) ){
    assert( ExprUseXList(pExpr) );
    pExpr = pExpr->x.pList->a[0].pExpr;
  }

  if( pExpr->op==TK_COLUMN ){
    aiCurCol[0] = pExpr->iTable;
    aiCurCol[1] = pExpr->iColumn;
    return 1;
  }

  for(i=0; i<pFrom->nSrc; i++){
    Index *pIdx;
    for(pIdx=pFrom->a[i].pSTab->pIndex; pIdx; pIdx=pIdx->pNext){
      if( pIdx->aColExpr ){
        return exprMightBeIndexed2(pFrom,aiCurCol,pExpr,i);
      }
    }
  }
  return 0;
}